

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

QRgbaFloat<float> *
convertGrayscale8To<QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,uint *src,int count,QList<unsigned_int> *param_4,
          QDitherInfo *param_5)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  
  if (0 < count) {
    lVar2 = 0;
    do {
      fVar3 = (float)*(byte *)((long)src + lVar2) * 0.003921569;
      pfVar1 = &buffer->r + lVar2;
      *pfVar1 = fVar3;
      pfVar1[1] = fVar3;
      pfVar1[2] = fVar3;
      pfVar1[3] = 1.0;
      lVar2 = lVar2 + 4;
    } while ((ulong)(uint)count << 2 != lVar2);
  }
  return buffer;
}

Assistant:

static const QRgba *QT_FASTCALL convertGrayscale8To(QRgba *buffer, const uint *src, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = QRgba::fromRgba(src[i], src[i], src[i], 255);
    return buffer;
}